

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

int ovf::detail::parse::segment_header(ovf_file *file,int index,ovf_segment *segment)

{
  parser_state *ppVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  int *in_R8;
  exception ex;
  string line;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in;
  
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
  memory_input<char_const(&)[1]>
            ((memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)&in,(file->_state->file_contents).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + index,(char (*) [1])0x146b19);
  ppVar1 = file->_state;
  ppVar1->found_title = false;
  ppVar1->found_meshunit = false;
  ppVar1->found_valuedim = false;
  ppVar1->found_valueunits = false;
  ppVar1->found_valuelabels = false;
  ppVar1->found_xmin = false;
  ppVar1->found_ymin = false;
  ppVar1->found_zmin = false;
  ppVar1->found_xmax = false;
  ppVar1->found_ymax = false;
  ppVar1->found_zmax = false;
  ppVar1->found_meshtype = false;
  ppVar1->found_xbase = false;
  ppVar1->found_ybase = false;
  ppVar1->found_zbase = false;
  ppVar1->found_xstepsize = false;
  ppVar1->found_zbase = false;
  ppVar1->found_xstepsize = false;
  ppVar1->found_ystepsize = false;
  ppVar1->found_zstepsize = false;
  ppVar1->found_xnodes = false;
  ppVar1->found_ynodes = false;
  ppVar1->found_znodes = false;
  ppVar1->found_pointcount = false;
  iVar4 = -3;
  if (file->version == 1) {
    fmt::v5::format<char[73],char_const*,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
               (v5 *)"libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [73])file,(char **)&file->version,in_R8);
  }
  else {
    if (file->version == 2) {
      bVar2 = tao::pegtl::internal::plus<ovf::detail::parse::v2::segment_header>::
              match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_ovf::detail::parse::v2::ovf_segment_header_action,_ovf::detail::parse::v2::ovf_segment_header_control,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_ovf_segment_&>
                        (&in,file,segment);
      if (bVar2) {
        iVar4 = -1;
      }
      else {
        std::__cxx11::string::assign((char *)&file->_state->message_latest);
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 (string *)
                                 ((file->_state->file_contents).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + index));
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      goto LAB_0012c804;
    }
    fmt::v5::format<char[73],char_const*,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
               (v5 *)"libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [73])file,(char **)&file->version,in_R8);
  }
  std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&ex);
  std::__cxx11::string::~string((string *)&ex);
LAB_0012c804:
  std::__cxx11::string::~string
            ((string *)
             &in.
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_source);
  return iVar4;
}

Assistant:

inline int segment_header(ovf_file & file, int index, ovf_segment & segment)
    try
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        file._state->found_title        = false;
        file._state->found_meshunit     = false;
        file._state->found_valuedim     = false;
        file._state->found_valueunits   = false;
        file._state->found_valuelabels  = false;
        file._state->found_xmin         = false;
        file._state->found_ymin         = false;
        file._state->found_zmin         = false;
        file._state->found_xmax         = false;
        file._state->found_ymax         = false;
        file._state->found_zmax         = false;
        file._state->found_meshtype     = false;
        file._state->found_xbase        = false;
        file._state->found_ybase        = false;
        file._state->found_zbase        = false;
        file._state->found_xstepsize    = false;
        file._state->found_ystepsize    = false;
        file._state->found_zstepsize    = false;
        file._state->found_xnodes       = false;
        file._state->found_ynodes       = false;
        file._state->found_znodes       = false;
        file._state->found_pointcount   = false;
        bool success = false;

        if( file.version == 2 )
        {
            success = pegtl::parse< pegtl::plus<v2::segment_header>, v2::ovf_segment_header_action, v2::ovf_segment_header_control >( in, file, segment );
        }
        else if( file.version == 1 )
        {
            // TODO...
            file._state->message_latest = fmt::format(
                "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }
        else
        {
            file._state->message_latest = fmt::format(
                "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }

        if( success )
            return OVF_OK;
        else
        {
            file._state->message_latest = "libovf segment_header: no success in parsing";
            std::cerr << file._state->file_contents[index] << std::endl;
            return OVF_INVALID;
        }
    }
    catch( v2::keyword_value_line_error & err )
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        const auto p = err.positions.front();
        std::string line = in.line_at(p);
        file._state->message_latest = fmt::format(
            "libovf segment_header: Expected an empty line or a line containing a keyword and a value!"
            "Found the following line instead:\n\"{}\"", line);
        return OVF_ERROR;
    }
    catch( pegtl::parse_error & err )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_header: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_header: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        file._state->message_latest = "libovf segment_header: unknown exception";
        return OVF_ERROR;
    }